

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescue.c
# Opt level: O1

int help(void)

{
  int iVar1;
  
  fwrite("rescue - A cross-platform resource compiler.\n\n",0x2e,1,_stderr);
  fwrite("Usage: rescue [-h] [-v] [-o <path>] [-a] [-b] [-r <path>] [-p <prefix>] <file1> ...\n",
         0x54,1,_stderr);
  fwrite(" -h\t\tPrint help.\n",0x11,1,_stderr);
  fwrite(" -v\t\tBe verbose.\n",0x11,1,_stderr);
  fwrite(" -o <path>\tOutput the resulting C source to the given file instead of printing it to standard output.\n\t\tThis flag can only be used before any source file is provided.\n"
         ,0xa7,1,_stderr);
  fwrite(" -a\t\tSet the naming mode of the files to absolute name.\n\t\tThe embedded names of the files will include the full absolute name of the file.\n"
         ,0x8b,1,_stderr);
  fwrite(" -b\t\tSet the naming mode of the files to file basename.\n\t\tThe embedded names of the files will include only the basename of the file.\n"
         ,0x86,1,_stderr);
  fwrite(" -p <prefix>\tUse the following alphanumerical string as a prefix for the functions and\n\t\tvariables in the generated file (instead of `rescue`).\n\t\tThis flag can only be used before any source file is provided.\n"
         ,0xd1,1,_stderr);
  iVar1 = fputc(10,_stderr);
  return iVar1;
}

Assistant:

int help()
{

    fprintf(stderr, "rescue - A cross-platform resource compiler.\n\n");
    fprintf(stderr, "Usage: rescue [-h] [-v] [-o <path>] [-a] [-b] [-r <path>] [-p <prefix>] <file1> ...\n");
    fprintf(stderr, " -h\t\tPrint help.\n");
    fprintf(stderr, " -v\t\tBe verbose.\n");
    fprintf(stderr, " -o <path>\tOutput the resulting C source to the given file instead of printing it to standard output.\n\t\tThis flag can only be used before any source file is provided.\n");
    // NOT IMPLEMENTED YET!
    //fprintf(stderr, " -r <path>\tSet the root direcotry for the following files.\n\t\tThe embedded names of the files will be relative to this path.\n");
    fprintf(stderr, " -a\t\tSet the naming mode of the files to absolute name.\n\t\tThe embedded names of the files will include the full absolute name of the file.\n");
    fprintf(stderr, " -b\t\tSet the naming mode of the files to file basename.\n\t\tThe embedded names of the files will include only the basename of the file.\n");
    fprintf(stderr, " -p <prefix>\tUse the following alphanumerical string as a prefix for the functions and\n\t\tvariables in the generated file (instead of `rescue`).\n\t\tThis flag can only be used before any source file is provided.\n");
    fprintf(stderr, "\n");

}